

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O3

void __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Parse(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        *this,Ch *uri,size_t len)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  Ch *__s;
  
  Allocate(this,len);
  if (len == 0) goto LAB_001203a9;
  sVar5 = 0;
  uVar6 = 0;
  do {
    if (uri[uVar6] == ':') {
      if (len == uVar6) goto LAB_001203a9;
      uVar7 = 0;
      goto LAB_00120368;
    }
    uVar6 = uVar6 + 1;
  } while (len != uVar6);
  goto LAB_001203ab;
  while (uVar7 = uVar7 + 1, uVar3 = len, len != uVar7) {
LAB_00120368:
    if (((ulong)(byte)uri[uVar7] < 0x40) &&
       (uVar3 = uVar7, (0x8000800800000000U >> ((ulong)(byte)uri[uVar7] & 0x3f) & 1) != 0)) break;
  }
  if (uVar6 < uVar3) {
    sVar5 = uVar6 + 1;
    memcpy(this->scheme_,uri,sVar5);
    this->scheme_[uVar6 + 1] = '\0';
  }
  else {
LAB_001203a9:
    sVar5 = 0;
  }
LAB_001203ab:
  pcVar1 = this->scheme_;
  if (pcVar1 == (char *)0x0) {
    uVar6 = 0;
  }
  else {
    sVar4 = strlen(pcVar1);
    uVar6 = sVar4 & 0xffffffff;
  }
  this->auth_ = pcVar1 + uVar6 + 1;
  pcVar1[uVar6 + 1] = '\0';
  uVar6 = sVar5;
  if (((sVar5 < len - 1) && (uri[sVar5] == '/')) && ((uri + sVar5)[1] == '/')) {
    uVar7 = sVar5 + 2;
    uVar6 = uVar7;
    if (uVar7 < len) {
      do {
        if (((ulong)(byte)uri[uVar7] < 0x40) &&
           (uVar6 = uVar7, (0x8000800800000000U >> ((ulong)(byte)uri[uVar7] & 0x3f) & 1) != 0))
        break;
        uVar7 = uVar7 + 1;
        uVar6 = len;
      } while (len != uVar7);
    }
    memcpy(this->auth_,uri + sVar5,uVar6 - sVar5);
    this->auth_[uVar6 - sVar5] = '\0';
  }
  pcVar1 = this->auth_;
  if (pcVar1 == (char *)0x0) {
    uVar7 = 0;
  }
  else {
    sVar5 = strlen(pcVar1);
    uVar7 = sVar5 & 0xffffffff;
  }
  this->path_ = pcVar1 + uVar7 + 1;
  pcVar1[uVar7 + 1] = '\0';
  sVar8 = uVar6;
  if (uVar6 < len) {
    do {
      uVar7 = sVar8;
      if ((uri[sVar8] == '#') || (uri[sVar8] == '?')) break;
      sVar8 = sVar8 + 1;
      uVar7 = len;
    } while (len != sVar8);
    sVar5 = uVar7 - uVar6;
    if (sVar5 != 0) {
      memcpy(this->path_,uri + uVar6,sVar5);
      this->path_[sVar5] = '\0';
      __s = this->path_;
      if (*__s != '/') goto LAB_0012048f;
      RemoveDotSegments(this);
      uVar6 = uVar7;
    }
  }
  uVar7 = uVar6;
  __s = this->path_;
LAB_0012048f:
  sVar5 = strlen(__s);
  this->query_ = __s + (sVar5 & 0xffffffff) + 1;
  __s[(sVar5 & 0xffffffff) + 1] = '\0';
  if ((uVar7 < len) && (uri[uVar7] == '?')) {
    uVar6 = uVar7;
    do {
      uVar3 = len;
      if (len - 1 == uVar6) break;
      uVar3 = uVar6 + 1;
      lVar2 = uVar6 + 1;
      uVar6 = uVar3;
    } while (uri[lVar2] != '#');
    sVar5 = uVar3 - uVar7;
    if (sVar5 != 0) {
      memcpy(this->query_,uri + uVar7,sVar5);
      this->query_[sVar5] = '\0';
      uVar7 = uVar3;
    }
  }
  pcVar1 = this->query_;
  if (pcVar1 == (char *)0x0) {
    uVar6 = 0;
  }
  else {
    sVar5 = strlen(pcVar1);
    uVar6 = sVar5 & 0xffffffff;
  }
  this->frag_ = pcVar1 + uVar6 + 1;
  pcVar1[uVar6 + 1] = '\0';
  sVar5 = len - uVar7;
  if ((uVar7 <= len && sVar5 != 0) && (uri[uVar7] == '#')) {
    memcpy(this->frag_,uri + uVar7,sVar5);
    this->frag_[sVar5] = '\0';
  }
  pcVar1 = this->frag_;
  if (pcVar1 == (char *)0x0) {
    uVar6 = 0;
  }
  else {
    sVar5 = strlen(pcVar1);
    uVar6 = sVar5 & 0xffffffff;
  }
  this->base_ = pcVar1 + uVar6 + 1;
  SetBase(this);
  pcVar1 = this->base_;
  if (pcVar1 == (char *)0x0) {
    uVar6 = 0;
  }
  else {
    sVar5 = strlen(pcVar1);
    uVar6 = sVar5 & 0xffffffff;
  }
  this->uri_ = pcVar1 + uVar6 + 1;
  SetUri(this);
  return;
}

Assistant:

void Parse(const Ch* uri, std::size_t len) {
        std::size_t start = 0, pos1 = 0, pos2 = 0;
        Allocate(len);

        // Look for scheme ([^:/?#]+):)?
        if (start < len) {
            while (pos1 < len) {
                if (uri[pos1] == ':') break;
                pos1++;
            }
            if (pos1 != len) {
                while (pos2 < len) {
                    if (uri[pos2] == '/') break;
                    if (uri[pos2] == '?') break;
                    if (uri[pos2] == '#') break;
                    pos2++;
                }
                if (pos1 < pos2) {
                    pos1++;
                    std::memcpy(scheme_, &uri[start], pos1 * sizeof(Ch));
                    scheme_[pos1] = '\0';
                    start = pos1;
                }
            }
        }
        // Look for auth (//([^/?#]*))?
        // Note need to set, increment, assign in 3 stages to avoid compiler warning bug.
        auth_ = scheme_ + GetSchemeStringLength();
        auth_++;
        *auth_ = '\0';
        if (start < len - 1 && uri[start] == '/' && uri[start + 1] == '/') {
            pos2 = start + 2;
            while (pos2 < len) {
                if (uri[pos2] == '/') break;
                if (uri[pos2] == '?') break;
                if (uri[pos2] == '#') break;
                pos2++;
            }
            std::memcpy(auth_, &uri[start], (pos2 - start) * sizeof(Ch));
            auth_[pos2 - start] = '\0';
            start = pos2;
        }
        // Look for path ([^?#]*)
        // Note need to set, increment, assign in 3 stages to avoid compiler warning bug.
        path_ = auth_ + GetAuthStringLength();
        path_++;
        *path_ = '\0';
        if (start < len) {
            pos2 = start;
            while (pos2 < len) {
                if (uri[pos2] == '?') break;
                if (uri[pos2] == '#') break;
                pos2++;
            }
            if (start != pos2) {
                std::memcpy(path_, &uri[start], (pos2 - start) * sizeof(Ch));
                path_[pos2 - start] = '\0';
                if (path_[0] == '/')
                    RemoveDotSegments();   // absolute path - normalize
                start = pos2;
            }
        }
        // Look for query (\?([^#]*))?
        // Note need to set, increment, assign in 3 stages to avoid compiler warning bug.
        query_ = path_ + GetPathStringLength();
        query_++;
        *query_ = '\0';
        if (start < len && uri[start] == '?') {
            pos2 = start + 1;
            while (pos2 < len) {
                if (uri[pos2] == '#') break;
                pos2++;
            }
            if (start != pos2) {
                std::memcpy(query_, &uri[start], (pos2 - start) * sizeof(Ch));
                query_[pos2 - start] = '\0';
                start = pos2;
            }
        }
        // Look for fragment (#(.*))?
        // Note need to set, increment, assign in 3 stages to avoid compiler warning bug.
        frag_ = query_ + GetQueryStringLength();
        frag_++;
        *frag_ = '\0';
        if (start < len && uri[start] == '#') {
            std::memcpy(frag_, &uri[start], (len - start) * sizeof(Ch));
            frag_[len - start] = '\0';
        }

        // Re-constitute base_ and uri_
        base_ = frag_ + GetFragStringLength() + 1;
        SetBase();
        uri_ = base_ + GetBaseStringLength() + 1;
        SetUri();
    }